

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

obj_property * lookup_obj_property_name(char *prop_name)

{
  int iVar1;
  obj_property *poVar2;
  int local_24;
  wchar_t i;
  obj_property *prop;
  char *prop_name_local;
  
  local_24 = 1;
  while( true ) {
    if ((int)(uint)z_info->property_max <= local_24) {
      return (obj_property *)0x0;
    }
    poVar2 = obj_properties + local_24;
    iVar1 = strcmp(poVar2->name,prop_name);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return poVar2;
}

Assistant:

struct obj_property *lookup_obj_property_name(const char *prop_name)
{
	struct obj_property *prop;
	int i;

	/* Find the right property */
	for (i = 1; i < z_info->property_max; i++) {
		prop = &obj_properties[i];
		if (streq(prop->name, prop_name)) {
			return prop;
		}
	}

	return NULL;
}